

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtoolbox.cpp
# Opt level: O1

void QToolBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  int iVar2;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_4c = *_a[1];
      puStack_40 = &local_4c;
      local_48 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_48);
      break;
    case 1:
      setCurrentIndex((QToolBox *)_o,*_a[1]);
      break;
    case 2:
      setCurrentWidget((QToolBox *)_o,*_a[1]);
      break;
    case 3:
      QToolBoxPrivate::_q_buttonClicked(*(QToolBoxPrivate **)(_o + 8));
      break;
    case 4:
      QToolBoxPrivate::_q_widgetDestroyed(*(QToolBoxPrivate **)(_o + 8),*_a[1]);
    }
    switch(_c) {
    case ReadProperty:
      break;
    case WriteProperty:
      goto switchD_004c108c_caseD_2;
    default:
      goto switchD_004c108c_caseD_3;
    case IndexOfMethod:
      goto switchD_004c108c_caseD_5;
    case RegisterMethodArgumentMetaType:
      goto switchD_004c108c_caseD_7;
    }
  case ReadProperty:
    break;
  case WriteProperty:
switchD_004c108c_caseD_2:
    if (_id != 0) goto switchD_004c108c_caseD_3;
    goto LAB_004c1204;
  default:
    goto switchD_004c108c_caseD_3;
  case IndexOfMethod:
switchD_004c108c_caseD_5:
    if ((*_a[1] == currentChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_004c108c_caseD_3;
    }
    if (_c == WriteProperty) goto switchD_004c108c_caseD_2;
    if (_c != ReadProperty) goto switchD_004c108c_caseD_3;
    break;
  case RegisterMethodArgumentMetaType:
switchD_004c108c_caseD_7:
    if (_id == 2) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_004c115f;
      *puVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
    }
    else {
      puVar3 = (undefined8 *)*_a;
LAB_004c115f:
      *puVar3 = 0;
    }
    if (_c != ReadProperty) {
      if (_c != WriteProperty) {
        if (_c != IndexOfMethod) goto switchD_004c108c_caseD_3;
        goto switchD_004c108c_caseD_5;
      }
      goto switchD_004c108c_caseD_2;
    }
  }
  piVar1 = (int *)*_a;
  if (_id == 1) {
    iVar2 = (int)((ulong)(*(long *)(*(long *)(_o + 8) + 0x280) -
                         *(long *)(*(long *)(_o + 8) + 0x278)) >> 3);
LAB_004c11f7:
    *piVar1 = iVar2;
  }
  else if (_id == 0) {
    if (*(long *)(*(long *)(_o + 8) + 0x298) == 0) {
      iVar2 = -1;
    }
    else {
      iVar2 = indexOf((QToolBox *)_o,*(QWidget **)(*(long *)(*(long *)(_o + 8) + 0x298) + 0x10));
    }
    goto LAB_004c11f7;
  }
  if (_c == WriteProperty && _id == 0) {
LAB_004c1204:
    setCurrentIndex((QToolBox *)_o,**_a);
  }
switchD_004c108c_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QToolBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 3: _t->d_func()->_q_buttonClicked(); break;
        case 4: _t->d_func()->_q_widgetDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QToolBox::*)(int )>(_a, &QToolBox::currentChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->count(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}